

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitRefI31(BinaryInstWriter *this,RefI31 *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Shareability SVar1;
  void *__buf;
  HeapType local_28;
  LEB<unsigned_int,_unsigned_char> local_20;
  uchar local_19;
  
  this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  local_19 = 0xfb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,&local_19);
  local_28 = wasm::Type::getHeapType
                       (&(curr->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression
                         .type);
  SVar1 = HeapType::getShared(&local_28);
  local_20.value = (uint)(SVar1 == Shared) * 3 + 0x1c;
  LEB<unsigned_int,_unsigned_char>::write(&local_20,(int)this_00,__buf,(ulong)(SVar1 == Shared));
  return;
}

Assistant:

void BinaryInstWriter::visitRefI31(RefI31* curr) {
  o << int8_t(BinaryConsts::GCPrefix)
    << U32LEB(curr->type.getHeapType().isShared() ? BinaryConsts::RefI31Shared
                                                  : BinaryConsts::RefI31);
}